

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_NodeStore_insert(UA_NodeStore *ns,UA_Node *node)

{
  UA_UInt32 size_00;
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_UInt32 UVar3;
  UA_UInt32 increase;
  UA_UInt32 size;
  UA_UInt32 identifier;
  UA_NodeStoreEntry **entry;
  UA_NodeId tempNodeid;
  UA_Node *node_local;
  UA_NodeStore *ns_local;
  
  tempNodeid.identifier.string.data = (UA_Byte *)node;
  if ((ns->count << 2 < ns->size * 3) || (UVar2 = expand(ns), UVar2 == 0)) {
    tempNodeid._0_8_ = *(undefined8 *)(tempNodeid.identifier.string.data + 8);
    tempNodeid.identifier.string.length = *(undefined8 *)(tempNodeid.identifier.string.data + 0x10);
    entry = (UA_NodeStoreEntry **)(*(ulong *)tempNodeid.identifier.string.data & 0xffffffffffff0000)
    ;
    UVar1 = UA_NodeId_isNull((UA_NodeId *)&entry);
    if (UVar1) {
      if (*(short *)tempNodeid.identifier.string.data == 0) {
        ((UA_Byte *)tempNodeid.identifier._8_8_)[0] = '\x01';
        ((UA_Byte *)tempNodeid.identifier._8_8_)[1] = '\0';
      }
      increase = ns->count + 1;
      size_00 = ns->size;
      UVar3 = mod2(increase,size_00);
      while( true ) {
        *(UA_UInt32 *)(tempNodeid.identifier.string.data + 8) = increase;
        _size = findSlot(ns,(UA_NodeId *)tempNodeid.identifier.string.data);
        if (_size != (UA_NodeStoreEntry **)0x0) break;
        increase = UVar3 + increase;
        if (size_00 <= increase) {
          increase = increase - size_00;
        }
      }
    }
    else {
      _size = findSlot(ns,(UA_NodeId *)tempNodeid.identifier.string.data);
      if (_size == (UA_NodeStoreEntry **)0x0) {
        UA_NodeStore_deleteNode((UA_Node *)tempNodeid.identifier.string.data);
        return 0x805e0000;
      }
    }
    *_size = (UA_NodeStoreEntry *)(tempNodeid.identifier.string.data + -8);
    ns->count = ns->count + 1;
    if (&(*_size)->node != (UA_Node *)tempNodeid.identifier.string.data) {
      __assert_fail("&(*entry)->node == node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x4b85,"UA_StatusCode UA_NodeStore_insert(UA_NodeStore *, UA_Node *)");
    }
    ns_local._4_4_ = 0;
  }
  else {
    ns_local._4_4_ = 0x80020000;
  }
  return ns_local._4_4_;
}

Assistant:

UA_StatusCode
UA_NodeStore_insert(UA_NodeStore *ns, UA_Node *node) {
    if(ns->size * 3 <= ns->count * 4) {
        if(expand(ns) != UA_STATUSCODE_GOOD)
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    UA_NodeId tempNodeid;
    tempNodeid = node->nodeId;
    tempNodeid.namespaceIndex = 0;
    UA_NodeStoreEntry **entry;
    if(UA_NodeId_isNull(&tempNodeid)) {
        /* create a random nodeid */
        if(node->nodeId.namespaceIndex == 0)
            node->nodeId.namespaceIndex = 1;
        UA_UInt32 identifier = ns->count+1; // start value
        UA_UInt32 size = ns->size;
        UA_UInt32 increase = mod2(identifier, size);
        while(true) {
            node->nodeId.identifier.numeric = identifier;
            entry = findSlot(ns, &node->nodeId);
            if(entry)
                break;
            identifier += increase;
            if(identifier >= size)
                identifier -= size;
        }
    } else {
        entry = findSlot(ns, &node->nodeId);
        if(!entry) {
            UA_NodeStore_deleteNode(node);
            return UA_STATUSCODE_BADNODEIDEXISTS;
        }
    }

    *entry = container_of(node, UA_NodeStoreEntry, node);
    ++ns->count;
    UA_assert(&(*entry)->node == node);
    return UA_STATUSCODE_GOOD;
}